

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall ncnn::Net::clear(Net *this)

{
  pointer ppLVar1;
  pointer ppLVar2;
  Layer *pLVar3;
  pointer pcVar4;
  layer_destroyer_func p_Var5;
  int iVar6;
  ulong uVar7;
  NetPrivate *pNVar8;
  size_t i;
  ulong uVar9;
  Option opt1;
  
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::clear(&this->d->blobs);
  uVar9 = 0;
  do {
    pNVar8 = this->d;
    ppLVar1 = (pNVar8->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar2 = (pNVar8->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppLVar2 - (long)ppLVar1 >> 3) <= uVar9) {
      if (ppLVar2 != ppLVar1) {
        (pNVar8->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppLVar1;
      }
      if (pNVar8->local_blob_allocator != (PoolAllocator *)0x0) {
        (*(pNVar8->local_blob_allocator->super_Allocator)._vptr_Allocator[1])();
        pNVar8 = this->d;
        pNVar8->local_blob_allocator = (PoolAllocator *)0x0;
      }
      if (pNVar8->local_workspace_allocator != (PoolAllocator *)0x0) {
        (*(pNVar8->local_workspace_allocator->super_Allocator)._vptr_Allocator[1])();
        this->d->local_workspace_allocator = (PoolAllocator *)0x0;
      }
      return;
    }
    pLVar3 = ppLVar1[uVar9];
    opt1.lightmode = (this->opt).lightmode;
    opt1._1_3_ = *(undefined3 *)&(this->opt).field_0x1;
    opt1.num_threads = (this->opt).num_threads;
    opt1.blob_allocator._0_4_ = *(undefined4 *)&(this->opt).blob_allocator;
    opt1.blob_allocator._4_4_ = *(undefined4 *)((long)&(this->opt).blob_allocator + 4);
    opt1.workspace_allocator._0_4_ = *(undefined4 *)&(this->opt).workspace_allocator;
    opt1.workspace_allocator._4_4_ = *(undefined4 *)((long)&(this->opt).workspace_allocator + 4);
    opt1.openmp_blocktime = (this->opt).openmp_blocktime;
    opt1.use_winograd_convolution = (this->opt).use_winograd_convolution;
    opt1.use_sgemm_convolution = (this->opt).use_sgemm_convolution;
    opt1.use_int8_inference = (this->opt).use_int8_inference;
    opt1.use_vulkan_compute = (this->opt).use_vulkan_compute;
    opt1.use_bf16_storage = (this->opt).use_bf16_storage;
    opt1.use_fp16_packed = (this->opt).use_fp16_packed;
    opt1.use_fp16_storage = (this->opt).use_fp16_storage;
    opt1.use_fp16_arithmetic = (this->opt).use_fp16_arithmetic;
    opt1.use_int8_packed = (this->opt).use_int8_packed;
    opt1.use_int8_storage = (this->opt).use_int8_storage;
    opt1.use_int8_arithmetic = (this->opt).use_int8_arithmetic;
    opt1.use_packing_layout = (this->opt).use_packing_layout;
    opt1.use_shader_pack8 = (this->opt).use_shader_pack8;
    opt1.use_subgroup_basic = (this->opt).use_subgroup_basic;
    opt1.use_subgroup_vote = (this->opt).use_subgroup_vote;
    opt1.use_subgroup_ballot = (this->opt).use_subgroup_ballot;
    opt1.use_subgroup_shuffle = (this->opt).use_subgroup_shuffle;
    opt1.use_image_storage = (this->opt).use_image_storage;
    opt1.use_tensor_storage = (this->opt).use_tensor_storage;
    opt1.use_reserved_0 = (this->opt).use_reserved_0;
    opt1.flush_denormals = (this->opt).flush_denormals;
    opt1.use_local_pool_allocator = (this->opt).use_local_pool_allocator;
    opt1.use_shader_local_memory = (this->opt).use_shader_local_memory;
    opt1.use_cooperative_matrix = (this->opt).use_cooperative_matrix;
    opt1.use_winograd23_convolution = (this->opt).use_winograd23_convolution;
    opt1.use_winograd43_convolution = (this->opt).use_winograd43_convolution;
    opt1.use_winograd63_convolution = (this->opt).use_winograd63_convolution;
    opt1.use_reserved_6 = (this->opt).use_reserved_6;
    opt1.use_reserved_7 = (this->opt).use_reserved_7;
    opt1.use_reserved_8 = (this->opt).use_reserved_8;
    opt1.use_reserved_9 = (this->opt).use_reserved_9;
    opt1.use_reserved_10 = (this->opt).use_reserved_10;
    opt1.use_reserved_11 = (this->opt).use_reserved_11;
    if (pLVar3->support_image_storage == false) {
      opt1.use_image_storage = false;
    }
    iVar6 = (*pLVar3->_vptr_Layer[5])(pLVar3,&opt1);
    if (iVar6 != 0) {
      fwrite("layer destroy_pipeline failed",0x1d,1,_stderr);
      fputc(10,_stderr);
    }
    if (((uint)pLVar3->typeindex >> 8 & 1) == 0) {
LAB_00162885:
      (*pLVar3->_vptr_Layer[1])(pLVar3);
    }
    else {
      uVar7 = (long)pLVar3->typeindex & 0x7fffffffffffeff;
      pcVar4 = (this->d->custom_layer_registry).
               super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var5 = pcVar4[uVar7].destroyer;
      if (p_Var5 == (layer_destroyer_func)0x0) goto LAB_00162885;
      (*p_Var5)(pLVar3,pcVar4[uVar7].userdata);
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void Net::clear()
{
    d->blobs.clear();
    for (size_t i = 0; i < d->layers.size(); i++)
    {
        Layer* layer = d->layers[i];

        Option opt1 = opt;
        if (!layer->support_image_storage)
        {
            opt1.use_image_storage = false;
        }

        int dret = layer->destroy_pipeline(opt1);
        if (dret != 0)
        {
            NCNN_LOGE("layer destroy_pipeline failed");
            // ignore anyway
        }

        if (layer->typeindex & ncnn::LayerType::CustomBit)
        {
            int custom_index = layer->typeindex & ~ncnn::LayerType::CustomBit;
            if (d->custom_layer_registry[custom_index].destroyer)
            {
                d->custom_layer_registry[custom_index].destroyer(layer, d->custom_layer_registry[custom_index].userdata);
            }
            else
            {
                delete layer;
            }
        }
        else
        {
            delete layer;
        }
    }
    d->layers.clear();

    if (d->local_blob_allocator)
    {
        delete d->local_blob_allocator;
        d->local_blob_allocator = 0;
    }
    if (d->local_workspace_allocator)
    {
        delete d->local_workspace_allocator;
        d->local_workspace_allocator = 0;
    }

#if NCNN_VULKAN
    if (d->weight_vkallocator)
    {
        delete d->weight_vkallocator;
        d->weight_vkallocator = 0;
    }
    if (d->weight_staging_vkallocator)
    {
        delete d->weight_staging_vkallocator;
        d->weight_staging_vkallocator = 0;
    }
    if (d->pipeline_cache)
    {
        delete d->pipeline_cache;
        d->pipeline_cache = 0;
        opt.pipeline_cache = 0;
    }
#endif // NCNN_VULKAN
}